

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

int side4_8d_filter(double *p0,double *p1,double *p2,double *p3,double *p4,double *q0,double *q1,
                   double *q2,double *q3)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  double dVar91;
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  
  dVar90 = *p0;
  dVar96 = p0[1];
  dVar99 = p0[2];
  dVar78 = p0[3];
  dVar86 = p0[4];
  dVar73 = p0[5];
  dVar104 = p0[6];
  dVar59 = *p2 - dVar90;
  dVar66 = p2[1] - dVar96;
  dVar47 = p2[2] - dVar99;
  dVar28 = p2[3] - dVar78;
  dVar4 = p2[5] - dVar73;
  dVar34 = p2[6] - dVar104;
  dVar80 = ABS(dVar28);
  if (ABS(dVar28) <= ABS(dVar4)) {
    dVar80 = ABS(dVar4);
  }
  dVar58 = ABS(dVar59);
  if (ABS(dVar59) <= dVar80) {
    dVar58 = dVar80;
  }
  dVar80 = ABS(dVar66);
  if (ABS(dVar66) <= dVar58) {
    dVar80 = dVar58;
  }
  dVar58 = ABS(dVar34);
  if (ABS(dVar34) <= dVar80) {
    dVar58 = dVar80;
  }
  dVar80 = ABS(dVar47);
  if (ABS(dVar47) <= dVar58) {
    dVar80 = dVar58;
  }
  dVar5 = p2[4] - dVar86;
  dVar58 = ABS(dVar5);
  if (ABS(dVar5) <= dVar80) {
    dVar58 = dVar80;
  }
  dVar80 = p0[7];
  dVar93 = p2[7] - dVar80;
  dVar94 = ABS(dVar93);
  if (ABS(dVar93) <= dVar58) {
    dVar94 = dVar58;
  }
  dVar29 = p1[3] - dVar78;
  dVar6 = p1[4] - dVar86;
  dVar58 = ABS(dVar29);
  if (ABS(dVar29) <= ABS(dVar6)) {
    dVar58 = ABS(dVar6);
  }
  dVar7 = p1[7] - dVar80;
  dVar23 = ABS(dVar7);
  if (ABS(dVar7) <= dVar58) {
    dVar23 = dVar58;
  }
  dVar30 = *p1 - dVar90;
  dVar58 = ABS(dVar30);
  if (ABS(dVar30) <= dVar23) {
    dVar58 = dVar23;
  }
  dVar8 = p1[2] - dVar99;
  dVar23 = ABS(dVar8);
  if (ABS(dVar8) <= dVar58) {
    dVar23 = dVar58;
  }
  dVar35 = p1[5] - dVar73;
  dVar58 = ABS(dVar35);
  if (ABS(dVar35) <= dVar23) {
    dVar58 = dVar23;
  }
  dVar31 = p1[1] - dVar96;
  dVar23 = ABS(dVar31);
  if (ABS(dVar31) <= dVar58) {
    dVar23 = dVar58;
  }
  dVar36 = *p3 - dVar90;
  dVar9 = p3[3] - dVar78;
  dVar58 = ABS(dVar36);
  if (ABS(dVar36) <= ABS(dVar9)) {
    dVar58 = ABS(dVar9);
  }
  dVar10 = p3[1] - dVar96;
  dVar82 = ABS(dVar10);
  if (ABS(dVar10) <= dVar58) {
    dVar82 = dVar58;
  }
  dVar37 = p3[2] - dVar99;
  dVar58 = ABS(dVar37);
  if (ABS(dVar37) <= dVar82) {
    dVar58 = dVar82;
  }
  dVar11 = p3[4] - dVar86;
  dVar82 = ABS(dVar11);
  if (ABS(dVar11) <= dVar58) {
    dVar82 = dVar58;
  }
  dVar38 = p3[5] - dVar73;
  dVar58 = ABS(dVar38);
  if (ABS(dVar38) <= dVar82) {
    dVar58 = dVar82;
  }
  dVar12 = p3[6] - dVar104;
  dVar82 = ABS(dVar12);
  if (ABS(dVar12) <= dVar58) {
    dVar82 = dVar58;
  }
  dVar32 = p3[7] - dVar80;
  dVar58 = ABS(dVar32);
  if (ABS(dVar32) <= dVar82) {
    dVar58 = dVar82;
  }
  dVar13 = *q0 - dVar90;
  dVar39 = q0[1] - dVar96;
  dVar82 = ABS(dVar39);
  if (ABS(dVar39) <= ABS(dVar13)) {
    dVar82 = ABS(dVar13);
  }
  dVar14 = q0[2] - dVar99;
  dVar52 = ABS(dVar14);
  if (ABS(dVar14) <= dVar82) {
    dVar52 = dVar82;
  }
  dVar40 = q0[3] - dVar78;
  dVar82 = ABS(dVar40);
  if (ABS(dVar40) <= dVar52) {
    dVar82 = dVar52;
  }
  dVar15 = q0[4] - dVar86;
  dVar52 = ABS(dVar15);
  if (ABS(dVar15) <= dVar82) {
    dVar52 = dVar82;
  }
  dVar41 = q0[5] - dVar73;
  dVar82 = ABS(dVar41);
  if (ABS(dVar41) <= dVar52) {
    dVar82 = dVar52;
  }
  dVar48 = q0[6] - dVar104;
  dVar52 = ABS(dVar48);
  if (ABS(dVar48) <= dVar82) {
    dVar52 = dVar82;
  }
  dVar16 = q0[7] - dVar80;
  dVar82 = ABS(dVar16);
  if (ABS(dVar16) <= dVar52) {
    dVar82 = dVar52;
  }
  dVar49 = *q1 - dVar90;
  dVar42 = q1[1] - dVar96;
  dVar50 = ABS(dVar49);
  dVar43 = ABS(dVar42);
  dVar52 = dVar43;
  if (dVar43 <= dVar50) {
    dVar52 = dVar50;
  }
  if (dVar50 <= dVar82) {
    dVar50 = dVar82;
  }
  if (dVar43 <= dVar50) {
    dVar43 = dVar50;
  }
  dVar51 = q1[2] - dVar99;
  dVar50 = ABS(dVar51);
  dVar82 = dVar50;
  if (dVar50 <= dVar43) {
    dVar82 = dVar43;
  }
  dVar60 = q1[3] - dVar78;
  dVar43 = ABS(dVar60);
  dVar68 = dVar43;
  if (dVar43 <= dVar82) {
    dVar68 = dVar82;
  }
  dVar74 = q1[4] - dVar86;
  dVar75 = ABS(dVar74);
  dVar82 = dVar75;
  if (dVar75 <= dVar68) {
    dVar82 = dVar68;
  }
  dVar67 = q1[5] - dVar73;
  dVar68 = ABS(dVar67);
  dVar18 = dVar68;
  if (dVar68 <= dVar82) {
    dVar18 = dVar82;
  }
  dVar81 = q1[6] - dVar104;
  dVar82 = ABS(dVar81);
  dVar24 = dVar82;
  if (dVar82 <= dVar18) {
    dVar24 = dVar18;
  }
  dVar17 = q1[7] - dVar80;
  dVar18 = ABS(dVar17);
  dVar100 = dVar18;
  if (dVar18 <= dVar24) {
    dVar100 = dVar24;
  }
  if (dVar50 <= dVar52) {
    dVar50 = dVar52;
  }
  if (dVar43 <= dVar50) {
    dVar43 = dVar50;
  }
  if (dVar75 <= dVar43) {
    dVar75 = dVar43;
  }
  if (dVar68 <= dVar75) {
    dVar68 = dVar75;
  }
  if (dVar82 <= dVar68) {
    dVar82 = dVar68;
  }
  if (dVar18 <= dVar82) {
    dVar18 = dVar82;
  }
  dVar68 = *q2 - dVar90;
  dVar43 = q2[1] - dVar96;
  dVar52 = ABS(dVar68);
  dVar50 = ABS(dVar43);
  dVar82 = dVar50;
  if (dVar50 <= dVar52) {
    dVar82 = dVar52;
  }
  if (dVar52 <= dVar18) {
    dVar52 = dVar18;
  }
  if (dVar50 <= dVar52) {
    dVar50 = dVar52;
  }
  dVar18 = q2[2] - dVar99;
  dVar52 = ABS(dVar18);
  dVar75 = dVar52;
  if (dVar52 <= dVar50) {
    dVar75 = dVar50;
  }
  dVar61 = q2[3] - dVar78;
  dVar50 = ABS(dVar61);
  dVar24 = dVar50;
  if (dVar50 <= dVar75) {
    dVar24 = dVar75;
  }
  dVar53 = q2[4] - dVar86;
  dVar75 = ABS(dVar53);
  dVar25 = dVar75;
  if (dVar75 <= dVar24) {
    dVar25 = dVar24;
  }
  if (dVar52 <= dVar82) {
    dVar52 = dVar82;
  }
  if (dVar50 <= dVar52) {
    dVar50 = dVar52;
  }
  if (dVar75 <= dVar50) {
    dVar75 = dVar50;
  }
  dVar50 = q2[5] - dVar73;
  dVar52 = ABS(dVar50);
  dVar82 = dVar52;
  if (dVar52 <= dVar75) {
    dVar82 = dVar75;
  }
  dVar44 = q2[6] - dVar104;
  dVar75 = ABS(dVar44);
  dVar24 = dVar75;
  if (dVar75 <= dVar82) {
    dVar24 = dVar82;
  }
  dVar19 = q2[7] - dVar80;
  dVar20 = ABS(dVar19);
  dVar82 = dVar20;
  if (dVar20 <= dVar24) {
    dVar82 = dVar24;
  }
  dVar54 = *q3 - dVar90;
  dVar24 = ABS(dVar54);
  if (ABS(dVar54) <= dVar82) {
    dVar24 = dVar82;
  }
  dVar21 = q3[1] - dVar96;
  dVar82 = ABS(dVar21);
  if (ABS(dVar21) <= dVar24) {
    dVar82 = dVar24;
  }
  dVar87 = q3[2] - dVar99;
  dVar24 = ABS(dVar87);
  if (ABS(dVar87) <= dVar82) {
    dVar24 = dVar82;
  }
  dVar69 = q3[3] - dVar78;
  dVar82 = ABS(dVar69);
  if (ABS(dVar69) <= dVar24) {
    dVar82 = dVar24;
  }
  dVar83 = q3[4] - dVar86;
  dVar24 = ABS(dVar83);
  if (ABS(dVar83) <= dVar82) {
    dVar24 = dVar82;
  }
  dVar55 = q3[5] - dVar73;
  dVar82 = ABS(dVar55);
  if (ABS(dVar55) <= dVar24) {
    dVar82 = dVar24;
  }
  dVar97 = p1[6] - dVar104;
  dVar70 = q3[6] - dVar104;
  dVar22 = q3[7] - dVar80;
  dVar24 = dVar94;
  dVar26 = dVar100;
  if ((dVar100 <= dVar94) && (dVar24 = dVar100, dVar100 < dVar94)) {
    dVar26 = dVar94;
  }
  if (dVar52 <= dVar25) {
    dVar52 = dVar25;
  }
  dVar25 = ABS(dVar70);
  if (ABS(dVar70) <= dVar82) {
    dVar25 = dVar82;
  }
  dVar82 = ABS(dVar97);
  if (ABS(dVar97) <= dVar23) {
    dVar82 = dVar23;
  }
  dVar23 = dVar58;
  if ((dVar24 <= dVar58) && (dVar23 = dVar24, dVar26 < dVar58)) {
    dVar26 = dVar58;
  }
  if (dVar75 <= dVar52) {
    dVar75 = dVar52;
  }
  dVar52 = ABS(dVar22);
  if (ABS(dVar22) <= dVar25) {
    dVar52 = dVar25;
  }
  dVar24 = dVar82;
  if ((dVar23 <= dVar82) && (dVar24 = dVar23, dVar26 < dVar82)) {
    dVar26 = dVar82;
  }
  if (dVar20 <= dVar75) {
    dVar20 = dVar75;
  }
  dVar23 = dVar52;
  if ((dVar24 <= dVar52) && (dVar23 = dVar24, dVar26 < dVar52)) {
    dVar26 = dVar52;
  }
  dVar75 = dVar20;
  if ((dVar23 <= dVar20) && (dVar75 = dVar23, dVar26 < dVar20)) {
    dVar26 = dVar20;
  }
  iVar1 = 0;
  iVar3 = 0;
  if ((2.825284831947541e-50 <= dVar75) && (iVar3 = iVar1, dVar26 <= 4.8357032784585156e+24)) {
    dVar23 = dVar7 * dVar16 +
             dVar97 * dVar48 +
             dVar35 * dVar41 +
             dVar6 * dVar15 + dVar29 * dVar40 + dVar8 * dVar14 + dVar30 * dVar13 + dVar31 * dVar39;
    dVar75 = dVar7 * dVar17 +
             dVar97 * dVar81 +
             dVar35 * dVar67 +
             dVar6 * dVar74 + dVar29 * dVar60 + dVar8 * dVar51 + dVar30 * dVar49 + dVar31 * dVar42;
    dVar102 = dVar7 * dVar19 +
              dVar97 * dVar44 +
              dVar35 * dVar50 +
              dVar6 * dVar53 + dVar29 * dVar61 + dVar8 * dVar18 + dVar30 * dVar68 + dVar31 * dVar43;
    dVar71 = dVar7 * dVar22 +
             dVar97 * dVar70 +
             dVar35 * dVar55 +
             dVar6 * dVar83 + dVar29 * dVar69 + dVar8 * dVar87 + dVar30 * dVar54 + dVar31 * dVar21;
    dVar76 = dVar93 * dVar16 +
             dVar34 * dVar48 +
             dVar4 * dVar41 +
             dVar5 * dVar15 + dVar28 * dVar40 + dVar47 * dVar14 + dVar59 * dVar13 + dVar66 * dVar39;
    dVar79 = dVar93 * dVar17 +
             dVar34 * dVar81 +
             dVar4 * dVar67 +
             dVar5 * dVar74 + dVar28 * dVar60 + dVar47 * dVar51 + dVar59 * dVar49 + dVar66 * dVar42;
    dVar84 = dVar93 * dVar19 +
             dVar34 * dVar44 +
             dVar4 * dVar50 +
             dVar5 * dVar53 + dVar28 * dVar61 + dVar47 * dVar18 + dVar59 * dVar68 + dVar66 * dVar43;
    dVar98 = dVar93 * dVar22 +
             dVar34 * dVar70 +
             dVar4 * dVar55 +
             dVar5 * dVar83 + dVar28 * dVar69 + dVar47 * dVar87 + dVar59 * dVar54 + dVar66 * dVar21;
    dVar24 = dVar32 * dVar16 +
             dVar12 * dVar48 +
             dVar38 * dVar41 +
             dVar11 * dVar15 + dVar9 * dVar40 + dVar37 * dVar14 + dVar36 * dVar13 + dVar10 * dVar39;
    dVar45 = dVar32 * dVar17 +
             dVar12 * dVar81 +
             dVar38 * dVar67 +
             dVar11 * dVar74 + dVar9 * dVar60 + dVar37 * dVar51 + dVar36 * dVar49 + dVar10 * dVar42;
    dVar56 = dVar32 * dVar19 +
             dVar12 * dVar44 +
             dVar38 * dVar50 +
             dVar11 * dVar53 + dVar9 * dVar61 + dVar37 * dVar18 + dVar36 * dVar68 + dVar10 * dVar43;
    dVar95 = dVar32 * dVar22 +
             dVar12 * dVar70 +
             dVar38 * dVar55 +
             dVar11 * dVar83 + dVar9 * dVar69 + dVar37 * dVar87 + dVar36 * dVar54 + dVar10 * dVar21;
    dVar102 = dVar102 + dVar102;
    dVar71 = dVar71 + dVar71;
    dVar79 = dVar79 + dVar79;
    dVar84 = dVar84 + dVar84;
    dVar98 = dVar98 + dVar98;
    dVar45 = dVar45 + dVar45;
    dVar56 = dVar56 + dVar56;
    dVar95 = dVar95 + dVar95;
    dVar91 = dVar84 * dVar95 - dVar56 * dVar98;
    dVar62 = dVar102 * dVar95 - dVar56 * dVar71;
    dVar101 = dVar102 * dVar98 - dVar84 * dVar71;
    dVar33 = dVar79 * dVar56 - dVar45 * dVar84;
    dVar75 = dVar75 + dVar75;
    dVar89 = dVar75 * dVar56 - dVar45 * dVar102;
    dVar88 = dVar75 * dVar84 - dVar79 * dVar102;
    dVar23 = dVar23 + dVar23;
    dVar76 = dVar76 + dVar76;
    dVar85 = dVar45 * dVar101 + (dVar75 * dVar91 - dVar62 * dVar79);
    dVar24 = dVar24 + dVar24;
    dVar103 = dVar24 * dVar101 + (dVar23 * dVar91 - dVar62 * dVar76);
    dVar63 = dVar79 * dVar95 - dVar98 * dVar45;
    dVar25 = dVar75 * dVar95 - dVar71 * dVar45;
    dVar77 = dVar75 * dVar98 - dVar71 * dVar79;
    dVar64 = dVar24 * dVar77 + (dVar23 * dVar63 - dVar25 * dVar76);
    dVar72 = dVar24 * dVar88 + (dVar23 * dVar33 - dVar89 * dVar76);
    dVar26 = dVar82 * dVar100 * dVar94 * dVar20 * dVar58 * dVar52 * 4.3749289469473104e-11;
    dVar46 = ((dVar85 - dVar103) + dVar64) - dVar72;
    iVar1 = 1;
    if ((dVar26 < dVar46) || (iVar1 = -1, dVar46 < -dVar26)) {
      dVar90 = *p4 - dVar90;
      dVar96 = p4[1] - dVar96;
      dVar99 = p4[2] - dVar99;
      dVar78 = p4[3] - dVar78;
      dVar86 = p4[4] - dVar86;
      dVar73 = p4[5] - dVar73;
      dVar104 = p4[6] - dVar104;
      dVar80 = p4[7] - dVar80;
      dVar26 = dVar58;
      if (dVar58 <= dVar94) {
        dVar26 = dVar94;
      }
      dVar57 = ABS(dVar78);
      if (ABS(dVar78) <= dVar82) {
        dVar57 = dVar82;
      }
      dVar65 = ABS(dVar96);
      if (ABS(dVar96) <= dVar57) {
        dVar65 = dVar57;
      }
      dVar57 = ABS(dVar86);
      if (ABS(dVar86) <= dVar65) {
        dVar57 = dVar65;
      }
      dVar65 = ABS(dVar90);
      if (ABS(dVar90) <= dVar57) {
        dVar65 = dVar57;
      }
      dVar57 = ABS(dVar99);
      if (ABS(dVar99) <= dVar65) {
        dVar57 = dVar65;
      }
      dVar65 = ABS(dVar73);
      if (ABS(dVar73) <= dVar57) {
        dVar65 = dVar57;
      }
      dVar57 = ABS(dVar104);
      if (ABS(dVar104) <= dVar65) {
        dVar57 = dVar65;
      }
      dVar65 = ABS(dVar80);
      if (ABS(dVar80) <= dVar57) {
        dVar65 = dVar57;
      }
      dVar57 = dVar65;
      if (dVar65 <= dVar26) {
        dVar57 = dVar26;
      }
      dVar26 = dVar82;
      if (dVar82 <= dVar57) {
        dVar26 = dVar57;
      }
      dVar57 = dVar52;
      if (dVar52 <= dVar26) {
        dVar57 = dVar26;
      }
      dVar26 = dVar82;
      if (dVar82 <= dVar65) {
        dVar26 = dVar65;
      }
      dVar92 = dVar20;
      if (dVar20 <= dVar26) {
        dVar92 = dVar26;
      }
      dVar26 = dVar20;
      if (dVar20 <= dVar100) {
        dVar26 = dVar100;
      }
      dVar27 = dVar26;
      if (dVar26 <= dVar100) {
        dVar27 = dVar100;
      }
      if (dVar82 <= dVar27) {
        dVar82 = dVar27;
      }
      if (dVar52 <= dVar82) {
        dVar52 = dVar82;
      }
      dVar82 = dVar92;
      dVar100 = dVar26;
      if ((dVar26 <= dVar92) && (dVar82 = dVar26, dVar26 < dVar92)) {
        dVar100 = dVar92;
      }
      if (dVar20 <= dVar52) {
        dVar20 = dVar52;
      }
      dVar52 = dVar57;
      if ((dVar82 <= dVar57) && (dVar52 = dVar82, dVar100 < dVar57)) {
        dVar100 = dVar57;
      }
      dVar82 = dVar94;
      if (dVar52 <= dVar94) {
        dVar82 = dVar52;
      }
      dVar52 = dVar58;
      if (dVar82 <= dVar58) {
        dVar52 = dVar82;
      }
      dVar82 = dVar65;
      if (dVar52 <= dVar65) {
        dVar82 = dVar52;
      }
      dVar52 = dVar20;
      if ((dVar82 <= dVar20) && (dVar52 = dVar82, dVar100 < dVar20)) {
        dVar100 = dVar20;
      }
      if ((4.1740251859728477e-38 <= dVar52) && (dVar100 <= 4.8357032784585156e+24)) {
        dVar52 = dVar98 * dVar24 - dVar95 * dVar76;
        dVar82 = dVar71 * dVar24 - dVar95 * dVar23;
        dVar100 = dVar71 * dVar76 - dVar98 * dVar23;
        dVar6 = dVar7 * dVar7 +
                dVar97 * dVar97 +
                dVar35 * dVar35 +
                dVar6 * dVar6 + dVar29 * dVar29 + dVar8 * dVar8 + dVar30 * dVar30 + dVar31 * dVar31;
        dVar47 = dVar93 * dVar93 +
                 dVar34 * dVar34 +
                 dVar4 * dVar4 +
                 dVar5 * dVar5 +
                 dVar28 * dVar28 + dVar47 * dVar47 + dVar59 * dVar59 + dVar66 * dVar66;
        dVar59 = dVar76 * dVar45 - dVar24 * dVar79;
        dVar4 = dVar45 * dVar23 - dVar24 * dVar75;
        dVar28 = dVar32 * dVar32 +
                 dVar12 * dVar12 +
                 dVar38 * dVar38 +
                 dVar11 * dVar11 +
                 dVar9 * dVar9 + dVar37 * dVar37 + dVar36 * dVar36 + dVar10 * dVar10;
        dVar34 = dVar23 * dVar79 - dVar76 * dVar75;
        dVar66 = dVar16 * dVar80 +
                 dVar48 * dVar104 +
                 dVar41 * dVar73 +
                 dVar15 * dVar86 +
                 dVar40 * dVar78 + dVar14 * dVar99 + dVar13 * dVar90 + dVar39 * dVar96;
        dVar29 = dVar17 * dVar80 +
                 dVar81 * dVar104 +
                 dVar67 * dVar73 +
                 dVar74 * dVar86 +
                 dVar60 * dVar78 + dVar51 * dVar99 + dVar49 * dVar90 + dVar42 * dVar96;
        dVar93 = dVar19 * dVar80 +
                 dVar44 * dVar104 +
                 dVar50 * dVar73 +
                 dVar53 * dVar86 +
                 dVar61 * dVar78 + dVar18 * dVar99 + dVar68 * dVar90 + dVar43 * dVar96;
        dVar5 = dVar22 * dVar80 +
                dVar70 * dVar104 +
                dVar55 * dVar73 +
                dVar83 * dVar86 +
                dVar69 * dVar78 + dVar87 * dVar99 + dVar54 * dVar90 + dVar21 * dVar96;
        dVar58 = dVar57 * dVar92 * dVar58 * dVar94 * dVar65 * dVar26 * dVar20 * dVar20 *
                 2.4149264560725403e-09;
        dVar90 = dVar46 * (dVar80 * dVar80 +
                          dVar104 * dVar104 +
                          dVar73 * dVar73 +
                          dVar86 * dVar86 +
                          dVar78 * dVar78 + dVar99 * dVar99 + dVar90 * dVar90 + dVar96 * dVar96) -
                 (((((dVar102 * dVar76 - dVar84 * dVar23) + dVar88 + dVar34) * dVar28 +
                   (((dVar84 * dVar24 - dVar76 * dVar56) + dVar33 + dVar59) * dVar6 -
                   ((dVar102 * dVar24 - dVar56 * dVar23) + dVar89 + dVar4) * dVar47)) - dVar72) *
                  (dVar5 + dVar5) +
                 (dVar64 + (((dVar25 + dVar82 + dVar4) * dVar47 - (dVar63 + dVar52 + dVar59) * dVar6
                            ) - (dVar77 + dVar100 + dVar34) * dVar28)) * (dVar93 + dVar93) +
                 ((((dVar84 * dVar23 - dVar102 * dVar76) + dVar101 + dVar100) * dVar28 +
                  (((dVar76 * dVar56 - dVar84 * dVar24) + dVar91 + dVar52) * dVar6 -
                  ((dVar56 * dVar23 - dVar102 * dVar24) + dVar62 + dVar82) * dVar47)) - dVar103) *
                 (dVar29 + dVar29) +
                 (dVar85 + ((((dVar71 * dVar45 - dVar75 * dVar95) + dVar62 + dVar89) * dVar47 -
                            ((dVar98 * dVar45 - dVar79 * dVar95) + dVar91 + dVar33) * dVar6) -
                           ((dVar71 * dVar79 - dVar75 * dVar98) + dVar101 + dVar88) * dVar28)) *
                 (dVar66 + dVar66));
        iVar2 = 1;
        if ((dVar58 < dVar90) || (iVar2 = -1, dVar90 < -dVar58)) {
          iVar3 = iVar2 * iVar1;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

inline int side4_8d_filter( const double* p0, const double* p1, const double* p2, const double* p3, const double* p4, const double* q0, const double* q1, const double* q2, const double* q3) {
    double p1_0_p0_0 = (p1[0] - p0[0]);
    double p1_1_p0_1 = (p1[1] - p0[1]);
    double p1_2_p0_2 = (p1[2] - p0[2]);
    double p1_3_p0_3 = (p1[3] - p0[3]);
    double p1_4_p0_4 = (p1[4] - p0[4]);
    double p1_5_p0_5 = (p1[5] - p0[5]);
    double p1_6_p0_6 = (p1[6] - p0[6]);
    double p1_7_p0_7 = (p1[7] - p0[7]);
    double l1;
    l1 = (1 * ((((((((p1_0_p0_0 * p1_0_p0_0) + (p1_1_p0_1 * p1_1_p0_1)) + (p1_2_p0_2 * p1_2_p0_2)) + (p1_3_p0_3 * p1_3_p0_3)) + (p1_4_p0_4 * p1_4_p0_4)) + (p1_5_p0_5 * p1_5_p0_5)) + (p1_6_p0_6 * p1_6_p0_6)) + (p1_7_p0_7 * p1_7_p0_7)));
    double p2_0_p0_0 = (p2[0] - p0[0]);
    double p2_1_p0_1 = (p2[1] - p0[1]);
    double p2_2_p0_2 = (p2[2] - p0[2]);
    double p2_3_p0_3 = (p2[3] - p0[3]);
    double p2_4_p0_4 = (p2[4] - p0[4]);
    double p2_5_p0_5 = (p2[5] - p0[5]);
    double p2_6_p0_6 = (p2[6] - p0[6]);
    double p2_7_p0_7 = (p2[7] - p0[7]);
    double l2;
    l2 = (1 * ((((((((p2_0_p0_0 * p2_0_p0_0) + (p2_1_p0_1 * p2_1_p0_1)) + (p2_2_p0_2 * p2_2_p0_2)) + (p2_3_p0_3 * p2_3_p0_3)) + (p2_4_p0_4 * p2_4_p0_4)) + (p2_5_p0_5 * p2_5_p0_5)) + (p2_6_p0_6 * p2_6_p0_6)) + (p2_7_p0_7 * p2_7_p0_7)));
    double p3_0_p0_0 = (p3[0] - p0[0]);
    double p3_1_p0_1 = (p3[1] - p0[1]);
    double p3_2_p0_2 = (p3[2] - p0[2]);
    double p3_3_p0_3 = (p3[3] - p0[3]);
    double p3_4_p0_4 = (p3[4] - p0[4]);
    double p3_5_p0_5 = (p3[5] - p0[5]);
    double p3_6_p0_6 = (p3[6] - p0[6]);
    double p3_7_p0_7 = (p3[7] - p0[7]);
    double l3;
    l3 = (1 * ((((((((p3_0_p0_0 * p3_0_p0_0) + (p3_1_p0_1 * p3_1_p0_1)) + (p3_2_p0_2 * p3_2_p0_2)) + (p3_3_p0_3 * p3_3_p0_3)) + (p3_4_p0_4 * p3_4_p0_4)) + (p3_5_p0_5 * p3_5_p0_5)) + (p3_6_p0_6 * p3_6_p0_6)) + (p3_7_p0_7 * p3_7_p0_7)));
    double p4_0_p0_0 = (p4[0] - p0[0]);
    double p4_1_p0_1 = (p4[1] - p0[1]);
    double p4_2_p0_2 = (p4[2] - p0[2]);
    double p4_3_p0_3 = (p4[3] - p0[3]);
    double p4_4_p0_4 = (p4[4] - p0[4]);
    double p4_5_p0_5 = (p4[5] - p0[5]);
    double p4_6_p0_6 = (p4[6] - p0[6]);
    double p4_7_p0_7 = (p4[7] - p0[7]);
    double l4;
    l4 = (1 * ((((((((p4_0_p0_0 * p4_0_p0_0) + (p4_1_p0_1 * p4_1_p0_1)) + (p4_2_p0_2 * p4_2_p0_2)) + (p4_3_p0_3 * p4_3_p0_3)) + (p4_4_p0_4 * p4_4_p0_4)) + (p4_5_p0_5 * p4_5_p0_5)) + (p4_6_p0_6 * p4_6_p0_6)) + (p4_7_p0_7 * p4_7_p0_7)));
    double q0_0_p0_0 = (q0[0] - p0[0]);
    double q0_1_p0_1 = (q0[1] - p0[1]);
    double q0_2_p0_2 = (q0[2] - p0[2]);
    double q0_3_p0_3 = (q0[3] - p0[3]);
    double q0_4_p0_4 = (q0[4] - p0[4]);
    double q0_5_p0_5 = (q0[5] - p0[5]);
    double q0_6_p0_6 = (q0[6] - p0[6]);
    double q0_7_p0_7 = (q0[7] - p0[7]);
    double a10;
    a10 = (2 * ((((((((p1_0_p0_0 * q0_0_p0_0) + (p1_1_p0_1 * q0_1_p0_1)) + (p1_2_p0_2 * q0_2_p0_2)) + (p1_3_p0_3 * q0_3_p0_3)) + (p1_4_p0_4 * q0_4_p0_4)) + (p1_5_p0_5 * q0_5_p0_5)) + (p1_6_p0_6 * q0_6_p0_6)) + (p1_7_p0_7 * q0_7_p0_7)));
    double q1_0_p0_0 = (q1[0] - p0[0]);
    double q1_1_p0_1 = (q1[1] - p0[1]);
    double q1_2_p0_2 = (q1[2] - p0[2]);
    double q1_3_p0_3 = (q1[3] - p0[3]);
    double q1_4_p0_4 = (q1[4] - p0[4]);
    double q1_5_p0_5 = (q1[5] - p0[5]);
    double q1_6_p0_6 = (q1[6] - p0[6]);
    double q1_7_p0_7 = (q1[7] - p0[7]);
    double a11;
    a11 = (2 * ((((((((p1_0_p0_0 * q1_0_p0_0) + (p1_1_p0_1 * q1_1_p0_1)) + (p1_2_p0_2 * q1_2_p0_2)) + (p1_3_p0_3 * q1_3_p0_3)) + (p1_4_p0_4 * q1_4_p0_4)) + (p1_5_p0_5 * q1_5_p0_5)) + (p1_6_p0_6 * q1_6_p0_6)) + (p1_7_p0_7 * q1_7_p0_7)));
    double q2_0_p0_0 = (q2[0] - p0[0]);
    double q2_1_p0_1 = (q2[1] - p0[1]);
    double q2_2_p0_2 = (q2[2] - p0[2]);
    double q2_3_p0_3 = (q2[3] - p0[3]);
    double q2_4_p0_4 = (q2[4] - p0[4]);
    double q2_5_p0_5 = (q2[5] - p0[5]);
    double q2_6_p0_6 = (q2[6] - p0[6]);
    double q2_7_p0_7 = (q2[7] - p0[7]);
    double a12;
    a12 = (2 * ((((((((p1_0_p0_0 * q2_0_p0_0) + (p1_1_p0_1 * q2_1_p0_1)) + (p1_2_p0_2 * q2_2_p0_2)) + (p1_3_p0_3 * q2_3_p0_3)) + (p1_4_p0_4 * q2_4_p0_4)) + (p1_5_p0_5 * q2_5_p0_5)) + (p1_6_p0_6 * q2_6_p0_6)) + (p1_7_p0_7 * q2_7_p0_7)));
    double q3_0_p0_0 = (q3[0] - p0[0]);
    double q3_1_p0_1 = (q3[1] - p0[1]);
    double q3_2_p0_2 = (q3[2] - p0[2]);
    double q3_3_p0_3 = (q3[3] - p0[3]);
    double q3_4_p0_4 = (q3[4] - p0[4]);
    double q3_5_p0_5 = (q3[5] - p0[5]);
    double q3_6_p0_6 = (q3[6] - p0[6]);
    double q3_7_p0_7 = (q3[7] - p0[7]);
    double a13;
    a13 = (2 * ((((((((p1_0_p0_0 * q3_0_p0_0) + (p1_1_p0_1 * q3_1_p0_1)) + (p1_2_p0_2 * q3_2_p0_2)) + (p1_3_p0_3 * q3_3_p0_3)) + (p1_4_p0_4 * q3_4_p0_4)) + (p1_5_p0_5 * q3_5_p0_5)) + (p1_6_p0_6 * q3_6_p0_6)) + (p1_7_p0_7 * q3_7_p0_7)));
    double a20;
    a20 = (2 * ((((((((p2_0_p0_0 * q0_0_p0_0) + (p2_1_p0_1 * q0_1_p0_1)) + (p2_2_p0_2 * q0_2_p0_2)) + (p2_3_p0_3 * q0_3_p0_3)) + (p2_4_p0_4 * q0_4_p0_4)) + (p2_5_p0_5 * q0_5_p0_5)) + (p2_6_p0_6 * q0_6_p0_6)) + (p2_7_p0_7 * q0_7_p0_7)));
    double a21;
    a21 = (2 * ((((((((p2_0_p0_0 * q1_0_p0_0) + (p2_1_p0_1 * q1_1_p0_1)) + (p2_2_p0_2 * q1_2_p0_2)) + (p2_3_p0_3 * q1_3_p0_3)) + (p2_4_p0_4 * q1_4_p0_4)) + (p2_5_p0_5 * q1_5_p0_5)) + (p2_6_p0_6 * q1_6_p0_6)) + (p2_7_p0_7 * q1_7_p0_7)));
    double a22;
    a22 = (2 * ((((((((p2_0_p0_0 * q2_0_p0_0) + (p2_1_p0_1 * q2_1_p0_1)) + (p2_2_p0_2 * q2_2_p0_2)) + (p2_3_p0_3 * q2_3_p0_3)) + (p2_4_p0_4 * q2_4_p0_4)) + (p2_5_p0_5 * q2_5_p0_5)) + (p2_6_p0_6 * q2_6_p0_6)) + (p2_7_p0_7 * q2_7_p0_7)));
    double a23;
    a23 = (2 * ((((((((p2_0_p0_0 * q3_0_p0_0) + (p2_1_p0_1 * q3_1_p0_1)) + (p2_2_p0_2 * q3_2_p0_2)) + (p2_3_p0_3 * q3_3_p0_3)) + (p2_4_p0_4 * q3_4_p0_4)) + (p2_5_p0_5 * q3_5_p0_5)) + (p2_6_p0_6 * q3_6_p0_6)) + (p2_7_p0_7 * q3_7_p0_7)));
    double a30;
    a30 = (2 * ((((((((p3_0_p0_0 * q0_0_p0_0) + (p3_1_p0_1 * q0_1_p0_1)) + (p3_2_p0_2 * q0_2_p0_2)) + (p3_3_p0_3 * q0_3_p0_3)) + (p3_4_p0_4 * q0_4_p0_4)) + (p3_5_p0_5 * q0_5_p0_5)) + (p3_6_p0_6 * q0_6_p0_6)) + (p3_7_p0_7 * q0_7_p0_7)));
    double a31;
    a31 = (2 * ((((((((p3_0_p0_0 * q1_0_p0_0) + (p3_1_p0_1 * q1_1_p0_1)) + (p3_2_p0_2 * q1_2_p0_2)) + (p3_3_p0_3 * q1_3_p0_3)) + (p3_4_p0_4 * q1_4_p0_4)) + (p3_5_p0_5 * q1_5_p0_5)) + (p3_6_p0_6 * q1_6_p0_6)) + (p3_7_p0_7 * q1_7_p0_7)));
    double a32;
    a32 = (2 * ((((((((p3_0_p0_0 * q2_0_p0_0) + (p3_1_p0_1 * q2_1_p0_1)) + (p3_2_p0_2 * q2_2_p0_2)) + (p3_3_p0_3 * q2_3_p0_3)) + (p3_4_p0_4 * q2_4_p0_4)) + (p3_5_p0_5 * q2_5_p0_5)) + (p3_6_p0_6 * q2_6_p0_6)) + (p3_7_p0_7 * q2_7_p0_7)));
    double a33;
    a33 = (2 * ((((((((p3_0_p0_0 * q3_0_p0_0) + (p3_1_p0_1 * q3_1_p0_1)) + (p3_2_p0_2 * q3_2_p0_2)) + (p3_3_p0_3 * q3_3_p0_3)) + (p3_4_p0_4 * q3_4_p0_4)) + (p3_5_p0_5 * q3_5_p0_5)) + (p3_6_p0_6 * q3_6_p0_6)) + (p3_7_p0_7 * q3_7_p0_7)));
    double a40;
    a40 = (2 * ((((((((p4_0_p0_0 * q0_0_p0_0) + (p4_1_p0_1 * q0_1_p0_1)) + (p4_2_p0_2 * q0_2_p0_2)) + (p4_3_p0_3 * q0_3_p0_3)) + (p4_4_p0_4 * q0_4_p0_4)) + (p4_5_p0_5 * q0_5_p0_5)) + (p4_6_p0_6 * q0_6_p0_6)) + (p4_7_p0_7 * q0_7_p0_7)));
    double a41;
    a41 = (2 * ((((((((p4_0_p0_0 * q1_0_p0_0) + (p4_1_p0_1 * q1_1_p0_1)) + (p4_2_p0_2 * q1_2_p0_2)) + (p4_3_p0_3 * q1_3_p0_3)) + (p4_4_p0_4 * q1_4_p0_4)) + (p4_5_p0_5 * q1_5_p0_5)) + (p4_6_p0_6 * q1_6_p0_6)) + (p4_7_p0_7 * q1_7_p0_7)));
    double a42;
    a42 = (2 * ((((((((p4_0_p0_0 * q2_0_p0_0) + (p4_1_p0_1 * q2_1_p0_1)) + (p4_2_p0_2 * q2_2_p0_2)) + (p4_3_p0_3 * q2_3_p0_3)) + (p4_4_p0_4 * q2_4_p0_4)) + (p4_5_p0_5 * q2_5_p0_5)) + (p4_6_p0_6 * q2_6_p0_6)) + (p4_7_p0_7 * q2_7_p0_7)));
    double a43;
    a43 = (2 * ((((((((p4_0_p0_0 * q3_0_p0_0) + (p4_1_p0_1 * q3_1_p0_1)) + (p4_2_p0_2 * q3_2_p0_2)) + (p4_3_p0_3 * q3_3_p0_3)) + (p4_4_p0_4 * q3_4_p0_4)) + (p4_5_p0_5 * q3_5_p0_5)) + (p4_6_p0_6 * q3_6_p0_6)) + (p4_7_p0_7 * q3_7_p0_7)));
    double b00;
    b00 = (((a11 * ((a22 * a33) - (a23 * a32))) - (a21 * ((a12 * a33) - (a13 * a32)))) + (a31 * ((a12 * a23) - (a13 * a22))));
    double b01;
    b01 = -((((a22 * a33) - (a23 * a32)) + ((a23 * a31) - (a21 * a33))) + ((a21 * a32) - (a22 * a31)));
    double b02;
    b02 = ((((a12 * a33) - (a13 * a32)) + ((a13 * a31) - (a11 * a33))) + ((a11 * a32) - (a12 * a31)));
    double b03;
    b03 = -((((a12 * a23) - (a13 * a22)) + ((a13 * a21) - (a11 * a23))) + ((a11 * a22) - (a12 * a21)));
    double b10;
    b10 = -(((a10 * ((a22 * a33) - (a23 * a32))) - (a20 * ((a12 * a33) - (a13 * a32)))) + (a30 * ((a12 * a23) - (a13 * a22))));
    double b11;
    b11 = ((((a22 * a33) - (a23 * a32)) + ((a23 * a30) - (a20 * a33))) + ((a20 * a32) - (a22 * a30)));
    double b12;
    b12 = -((((a12 * a33) - (a13 * a32)) + ((a13 * a30) - (a10 * a33))) + ((a10 * a32) - (a12 * a30)));
    double b13;
    b13 = ((((a12 * a23) - (a13 * a22)) + ((a13 * a20) - (a10 * a23))) + ((a10 * a22) - (a12 * a20)));
    double b20;
    b20 = (((a10 * ((a21 * a33) - (a23 * a31))) - (a20 * ((a11 * a33) - (a13 * a31)))) + (a30 * ((a11 * a23) - (a13 * a21))));
    double b21;
    b21 = -((((a21 * a33) - (a23 * a31)) + ((a23 * a30) - (a20 * a33))) + ((a20 * a31) - (a21 * a30)));
    double b22;
    b22 = ((((a11 * a33) - (a13 * a31)) + ((a13 * a30) - (a10 * a33))) + ((a10 * a31) - (a11 * a30)));
    double b23;
    b23 = -((((a11 * a23) - (a13 * a21)) + ((a13 * a20) - (a10 * a23))) + ((a10 * a21) - (a11 * a20)));
    double b30;
    b30 = -(((a10 * ((a21 * a32) - (a22 * a31))) - (a20 * ((a11 * a32) - (a12 * a31)))) + (a30 * ((a11 * a22) - (a12 * a21))));
    double b31;
    b31 = ((((a21 * a32) - (a22 * a31)) + ((a22 * a30) - (a20 * a32))) + ((a20 * a31) - (a21 * a30)));
    double b32;
    b32 = -((((a11 * a32) - (a12 * a31)) + ((a12 * a30) - (a10 * a32))) + ((a10 * a31) - (a11 * a30)));
    double b33;
    b33 = ((((a11 * a22) - (a12 * a21)) + ((a12 * a20) - (a10 * a22))) + ((a10 * a21) - (a11 * a20)));
    double Delta;
    Delta = (((b00 + b10) + b20) + b30);
    double DeltaLambda0;
    DeltaLambda0 = ((((b01 * l1) + (b02 * l2)) + (b03 * l3)) + b00);
    double DeltaLambda1;
    DeltaLambda1 = ((((b11 * l1) + (b12 * l2)) + (b13 * l3)) + b10);
    double DeltaLambda2;
    DeltaLambda2 = ((((b21 * l1) + (b22 * l2)) + (b23 * l3)) + b20);
    double DeltaLambda3;
    DeltaLambda3 = ((((b31 * l1) + (b32 * l2)) + (b33 * l3)) + b30);
    double r;
    r = ((Delta * l4) - ((((a40 * DeltaLambda0) + (a41 * DeltaLambda1)) + (a42 * DeltaLambda2)) + (a43 * DeltaLambda3)));
    double eps;
    double max1 = fabs(p2_5_p0_5);
    if( (max1 < fabs(p2_3_p0_3)) )
    {
        max1 = fabs(p2_3_p0_3);
    } 
    if( (max1 < fabs(p2_0_p0_0)) )
    {
        max1 = fabs(p2_0_p0_0);
    } 
    if( (max1 < fabs(p2_1_p0_1)) )
    {
        max1 = fabs(p2_1_p0_1);
    } 
    if( (max1 < fabs(p2_6_p0_6)) )
    {
        max1 = fabs(p2_6_p0_6);
    } 
    if( (max1 < fabs(p2_2_p0_2)) )
    {
        max1 = fabs(p2_2_p0_2);
    } 
    if( (max1 < fabs(p2_4_p0_4)) )
    {
        max1 = fabs(p2_4_p0_4);
    } 
    if( (max1 < fabs(p2_7_p0_7)) )
    {
        max1 = fabs(p2_7_p0_7);
    } 
    double max2 = fabs(p1_4_p0_4);
    if( (max2 < fabs(p1_3_p0_3)) )
    {
        max2 = fabs(p1_3_p0_3);
    } 
    if( (max2 < fabs(p1_7_p0_7)) )
    {
        max2 = fabs(p1_7_p0_7);
    } 
    if( (max2 < fabs(p1_0_p0_0)) )
    {
        max2 = fabs(p1_0_p0_0);
    } 
    if( (max2 < fabs(p1_2_p0_2)) )
    {
        max2 = fabs(p1_2_p0_2);
    } 
    if( (max2 < fabs(p1_5_p0_5)) )
    {
        max2 = fabs(p1_5_p0_5);
    } 
    if( (max2 < fabs(p1_1_p0_1)) )
    {
        max2 = fabs(p1_1_p0_1);
    } 
    if( (max2 < fabs(p1_6_p0_6)) )
    {
        max2 = fabs(p1_6_p0_6);
    } 
    double max3 = fabs(p3_3_p0_3);
    if( (max3 < fabs(p3_0_p0_0)) )
    {
        max3 = fabs(p3_0_p0_0);
    } 
    if( (max3 < fabs(p3_1_p0_1)) )
    {
        max3 = fabs(p3_1_p0_1);
    } 
    if( (max3 < fabs(p3_2_p0_2)) )
    {
        max3 = fabs(p3_2_p0_2);
    } 
    if( (max3 < fabs(p3_4_p0_4)) )
    {
        max3 = fabs(p3_4_p0_4);
    } 
    if( (max3 < fabs(p3_5_p0_5)) )
    {
        max3 = fabs(p3_5_p0_5);
    } 
    if( (max3 < fabs(p3_6_p0_6)) )
    {
        max3 = fabs(p3_6_p0_6);
    } 
    if( (max3 < fabs(p3_7_p0_7)) )
    {
        max3 = fabs(p3_7_p0_7);
    } 
    double max4 = fabs(q0_0_p0_0);
    if( (max4 < fabs(q0_1_p0_1)) )
    {
        max4 = fabs(q0_1_p0_1);
    } 
    if( (max4 < fabs(q0_2_p0_2)) )
    {
        max4 = fabs(q0_2_p0_2);
    } 
    if( (max4 < fabs(q0_3_p0_3)) )
    {
        max4 = fabs(q0_3_p0_3);
    } 
    if( (max4 < fabs(q0_4_p0_4)) )
    {
        max4 = fabs(q0_4_p0_4);
    } 
    if( (max4 < fabs(q0_5_p0_5)) )
    {
        max4 = fabs(q0_5_p0_5);
    } 
    if( (max4 < fabs(q0_6_p0_6)) )
    {
        max4 = fabs(q0_6_p0_6);
    } 
    if( (max4 < fabs(q0_7_p0_7)) )
    {
        max4 = fabs(q0_7_p0_7);
    } 
    if( (max4 < fabs(q1_0_p0_0)) )
    {
        max4 = fabs(q1_0_p0_0);
    } 
    if( (max4 < fabs(q1_1_p0_1)) )
    {
        max4 = fabs(q1_1_p0_1);
    } 
    if( (max4 < fabs(q1_2_p0_2)) )
    {
        max4 = fabs(q1_2_p0_2);
    } 
    if( (max4 < fabs(q1_3_p0_3)) )
    {
        max4 = fabs(q1_3_p0_3);
    } 
    if( (max4 < fabs(q1_4_p0_4)) )
    {
        max4 = fabs(q1_4_p0_4);
    } 
    if( (max4 < fabs(q1_5_p0_5)) )
    {
        max4 = fabs(q1_5_p0_5);
    } 
    if( (max4 < fabs(q1_6_p0_6)) )
    {
        max4 = fabs(q1_6_p0_6);
    } 
    if( (max4 < fabs(q1_7_p0_7)) )
    {
        max4 = fabs(q1_7_p0_7);
    } 
    double max5 = fabs(q1_0_p0_0);
    if( (max5 < fabs(q1_1_p0_1)) )
    {
        max5 = fabs(q1_1_p0_1);
    } 
    if( (max5 < fabs(q1_2_p0_2)) )
    {
        max5 = fabs(q1_2_p0_2);
    } 
    if( (max5 < fabs(q1_3_p0_3)) )
    {
        max5 = fabs(q1_3_p0_3);
    } 
    if( (max5 < fabs(q1_4_p0_4)) )
    {
        max5 = fabs(q1_4_p0_4);
    } 
    if( (max5 < fabs(q1_5_p0_5)) )
    {
        max5 = fabs(q1_5_p0_5);
    } 
    if( (max5 < fabs(q1_6_p0_6)) )
    {
        max5 = fabs(q1_6_p0_6);
    } 
    if( (max5 < fabs(q1_7_p0_7)) )
    {
        max5 = fabs(q1_7_p0_7);
    } 
    if( (max5 < fabs(q2_0_p0_0)) )
    {
        max5 = fabs(q2_0_p0_0);
    } 
    if( (max5 < fabs(q2_1_p0_1)) )
    {
        max5 = fabs(q2_1_p0_1);
    } 
    if( (max5 < fabs(q2_2_p0_2)) )
    {
        max5 = fabs(q2_2_p0_2);
    } 
    if( (max5 < fabs(q2_3_p0_3)) )
    {
        max5 = fabs(q2_3_p0_3);
    } 
    if( (max5 < fabs(q2_4_p0_4)) )
    {
        max5 = fabs(q2_4_p0_4);
    } 
    if( (max5 < fabs(q2_5_p0_5)) )
    {
        max5 = fabs(q2_5_p0_5);
    } 
    if( (max5 < fabs(q2_6_p0_6)) )
    {
        max5 = fabs(q2_6_p0_6);
    } 
    if( (max5 < fabs(q2_7_p0_7)) )
    {
        max5 = fabs(q2_7_p0_7);
    } 
    double max6 = fabs(q2_0_p0_0);
    if( (max6 < fabs(q2_1_p0_1)) )
    {
        max6 = fabs(q2_1_p0_1);
    } 
    if( (max6 < fabs(q2_2_p0_2)) )
    {
        max6 = fabs(q2_2_p0_2);
    } 
    if( (max6 < fabs(q2_3_p0_3)) )
    {
        max6 = fabs(q2_3_p0_3);
    } 
    if( (max6 < fabs(q2_4_p0_4)) )
    {
        max6 = fabs(q2_4_p0_4);
    } 
    if( (max6 < fabs(q2_5_p0_5)) )
    {
        max6 = fabs(q2_5_p0_5);
    } 
    if( (max6 < fabs(q2_6_p0_6)) )
    {
        max6 = fabs(q2_6_p0_6);
    } 
    if( (max6 < fabs(q2_7_p0_7)) )
    {
        max6 = fabs(q2_7_p0_7);
    } 
    if( (max6 < fabs(q3_0_p0_0)) )
    {
        max6 = fabs(q3_0_p0_0);
    } 
    if( (max6 < fabs(q3_1_p0_1)) )
    {
        max6 = fabs(q3_1_p0_1);
    } 
    if( (max6 < fabs(q3_2_p0_2)) )
    {
        max6 = fabs(q3_2_p0_2);
    } 
    if( (max6 < fabs(q3_3_p0_3)) )
    {
        max6 = fabs(q3_3_p0_3);
    } 
    if( (max6 < fabs(q3_4_p0_4)) )
    {
        max6 = fabs(q3_4_p0_4);
    } 
    if( (max6 < fabs(q3_5_p0_5)) )
    {
        max6 = fabs(q3_5_p0_5);
    } 
    if( (max6 < fabs(q3_6_p0_6)) )
    {
        max6 = fabs(q3_6_p0_6);
    } 
    if( (max6 < fabs(q3_7_p0_7)) )
    {
        max6 = fabs(q3_7_p0_7);
    } 
    double lower_bound_1;
    double upper_bound_1;
    int Delta_sign;
    int int_tmp_result;
    lower_bound_1 = max4;
    upper_bound_1 = max4;
    if( (max1 < lower_bound_1) )
    {
        lower_bound_1 = max1;
    } 
    else 
    {
        if( (max1 > upper_bound_1) )
        {
            upper_bound_1 = max1;
        } 
    } 
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    else 
    {
        if( (max3 > upper_bound_1) )
        {
            upper_bound_1 = max3;
        } 
    } 
    if( (max2 < lower_bound_1) )
    {
        lower_bound_1 = max2;
    } 
    else 
    {
        if( (max2 > upper_bound_1) )
        {
            upper_bound_1 = max2;
        } 
    } 
    if( (max6 < lower_bound_1) )
    {
        lower_bound_1 = max6;
    } 
    else 
    {
        if( (max6 > upper_bound_1) )
        {
            upper_bound_1 = max6;
        } 
    } 
    if( (max5 < lower_bound_1) )
    {
        lower_bound_1 = max5;
    } 
    else 
    {
        if( (max5 > upper_bound_1) )
        {
            upper_bound_1 = max5;
        } 
    } 
    if( (lower_bound_1 < 2.82528483194754087282e-50) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 4.83570327845851562508e+24) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (4.37492894694731040560e-11 * (((((max2 * max4) * max1) * max5) * max3) * max6));
        if( (Delta > eps) )
        {
            int_tmp_result = 1;
        } 
        else 
        {
            if( (Delta < -eps) )
            {
                int_tmp_result = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    Delta_sign = int_tmp_result;
    int int_tmp_result_FFWKCAA;
    double max7 = max1;
    if( (max7 < max3) )
    {
        max7 = max3;
    } 
    double max8 = max2;
    if( (max8 < fabs(p4_3_p0_3)) )
    {
        max8 = fabs(p4_3_p0_3);
    } 
    if( (max8 < fabs(p4_1_p0_1)) )
    {
        max8 = fabs(p4_1_p0_1);
    } 
    if( (max8 < fabs(p4_4_p0_4)) )
    {
        max8 = fabs(p4_4_p0_4);
    } 
    if( (max8 < fabs(p4_0_p0_0)) )
    {
        max8 = fabs(p4_0_p0_0);
    } 
    if( (max8 < fabs(p4_2_p0_2)) )
    {
        max8 = fabs(p4_2_p0_2);
    } 
    if( (max8 < fabs(p4_5_p0_5)) )
    {
        max8 = fabs(p4_5_p0_5);
    } 
    if( (max8 < fabs(p4_6_p0_6)) )
    {
        max8 = fabs(p4_6_p0_6);
    } 
    if( (max8 < fabs(p4_7_p0_7)) )
    {
        max8 = fabs(p4_7_p0_7);
    } 
    if( (max7 < max8) )
    {
        max7 = max8;
    } 
    if( (max7 < max2) )
    {
        max7 = max2;
    } 
    if( (max7 < max6) )
    {
        max7 = max6;
    } 
    double max9 = max8;
    if( (max9 < max2) )
    {
        max9 = max2;
    } 
    if( (max9 < max5) )
    {
        max9 = max5;
    } 
    double max10 = max4;
    double max11 = max4;
    if( (max11 < max5) )
    {
        max11 = max5;
    } 
    if( (max10 < max11) )
    {
        max10 = max11;
    } 
    if( (max10 < max2) )
    {
        max10 = max2;
    } 
    if( (max10 < max6) )
    {
        max10 = max6;
    } 
    if( (max10 < max5) )
    {
        max10 = max5;
    } 
    lower_bound_1 = max11;
    upper_bound_1 = max11;
    if( (max9 < lower_bound_1) )
    {
        lower_bound_1 = max9;
    } 
    else 
    {
        if( (max9 > upper_bound_1) )
        {
            upper_bound_1 = max9;
        } 
    } 
    if( (max7 < lower_bound_1) )
    {
        lower_bound_1 = max7;
    } 
    else 
    {
        if( (max7 > upper_bound_1) )
        {
            upper_bound_1 = max7;
        } 
    } 
    if( (max1 < lower_bound_1) )
    {
        lower_bound_1 = max1;
    } 
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    if( (max8 < lower_bound_1) )
    {
        lower_bound_1 = max8;
    } 
    if( (max10 < lower_bound_1) )
    {
        lower_bound_1 = max10;
    } 
    else 
    {
        if( (max10 > upper_bound_1) )
        {
            upper_bound_1 = max10;
        } 
    } 
    if( (lower_bound_1 < 4.17402518597284772324e-38) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 4.83570327845851562508e+24) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (2.41492645607254025015e-09 * (((((((max8 * max11) * max1) * max10) * max3) * max10) * max9) * max7));
        if( (r > eps) )
        {
            int_tmp_result_FFWKCAA = 1;
        } 
        else 
        {
            if( (r < -eps) )
            {
                int_tmp_result_FFWKCAA = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    return (Delta_sign * int_tmp_result_FFWKCAA);
}